

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_encoding.c
# Opt level: O0

CURLcode error_do_write(Curl_easy *data,Curl_cwriter *writer,int type,char *buf,size_t nbytes)

{
  char local_138 [8];
  char all [256];
  size_t nbytes_local;
  char *buf_local;
  int type_local;
  Curl_cwriter *writer_local;
  Curl_easy *data_local;
  
  all._248_8_ = nbytes;
  Curl_all_content_encodings(local_138,0x100);
  if ((type & 1U) == 0) {
    data_local._4_4_ = Curl_cwriter_write(data,writer->next,type,buf,all._248_8_);
  }
  else {
    Curl_failf(data,"Unrecognized content encoding type. libcurl understands %s content encodings.",
               local_138);
    data_local._4_4_ = CURLE_BAD_CONTENT_ENCODING;
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode error_do_write(struct Curl_easy *data,
                                     struct Curl_cwriter *writer, int type,
                                     const char *buf, size_t nbytes)
{
  char all[256];
  (void)Curl_all_content_encodings(all, sizeof(all));

  (void) writer;
  (void) buf;
  (void) nbytes;

  if(!(type & CLIENTWRITE_BODY))
    return Curl_cwriter_write(data, writer->next, type, buf, nbytes);

  failf(data, "Unrecognized content encoding type. "
        "libcurl understands %s content encodings.", all);
  return CURLE_BAD_CONTENT_ENCODING;
}